

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O3

bool __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,uint k,
          unsigned_long *lastOcc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type pNVar4;
  byte bVar5;
  uint uVar6;
  
  if (k < 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0x117,"(k >= directSize)","k >= directSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pNVar4 = this->root;
  if (pNVar4 == (Type)0x0) {
LAB_00e64326:
    bVar2 = false;
  }
  else {
    uVar6 = 4;
    bVar5 = 0xc;
    do {
      pNVar4 = (Type)pNVar4[(ulong)(k >> (bVar5 & 0x1f) & 0xf) + 1]._vptr_Node;
      if (pNVar4 == (Type)0x0) goto LAB_00e64326;
      uVar6 = uVar6 - 1;
      bVar5 = bVar5 - 4;
    } while (1 < uVar6);
    *lastOcc = (unsigned_long)pNVar4[(ulong)(k & 0xf) + 1]._vptr_Node;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool GetNonDirect(uint k, V& lastOcc) const
        {
            Assert(k >= directSize);
            if (root == nullptr)
            {
                return false;
            }
            Node* curr = root;
            for (int level = levels - 1; level > 0; level--)
            {
                Inner* inner = (Inner*)curr;
                uint i = innerIdx(level, k);
                if (inner->children[i] == 0)
                    return false;
                else
                    curr = inner->children[i];
            }
            Leaf* leaf = (Leaf*)curr;
            lastOcc = leaf->values[leafIdx(k)];
            return true;
        }